

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereShape.cpp
# Opt level: O3

btVector3 __thiscall btSphereShape::localGetSupportingVertex(btSphereShape *this,btVector3 *vec)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  float fVar4;
  float extraout_XMM0_Da;
  float fVar6;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar5 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  btVector3 bVar11;
  float local_28;
  float fStack_24;
  
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0x11])();
  fVar10 = vec->m_floats[2];
  uVar1 = *(ulong *)vec->m_floats;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1;
  fVar4 = (float)(uVar1 >> 0x20);
  fVar4 = fVar10 * fVar10 + (float)uVar1 * (float)uVar1 + fVar4 * fVar4;
  uVar3 = (uint)(fVar4 < 1.4210855e-14);
  auVar5._0_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar5._4_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar5._8_8_ = 0;
  auVar5 = auVar5 & _DAT_001f04c0 | ~auVar5 & auVar7;
  if (fVar4 < 1.4210855e-14) {
    fVar10 = -1.0;
  }
  fVar4 = auVar5._0_4_;
  fVar6 = auVar5._4_4_;
  fVar9 = 1.0 / SQRT(fVar10 * fVar10 + fVar4 * fVar4 + fVar6 * fVar6);
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  local_28 = (float)extraout_XMM0_Qa;
  fStack_24 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
  bVar11.m_floats[1] = fStack_24 + extraout_XMM0_Da * fVar9 * fVar6;
  bVar11.m_floats[0] = local_28 + extraout_XMM0_Da * fVar9 * fVar4;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = in_XMM1_Qa;
  auVar8._4_12_ = auVar2._4_12_;
  auVar8._0_4_ = (float)in_XMM1_Qa + fVar10 * fVar9 * extraout_XMM0_Da;
  bVar11.m_floats._8_8_ = auVar8._0_8_;
  return (btVector3)bVar11.m_floats;
}

Assistant:

btVector3	btSphereShape::localGetSupportingVertex(const btVector3& vec)const
{
	btVector3 supVertex;
	supVertex = localGetSupportingVertexWithoutMargin(vec);

	btVector3 vecnorm = vec;
	if (vecnorm .length2() < (SIMD_EPSILON*SIMD_EPSILON))
	{
		vecnorm.setValue(btScalar(-1.),btScalar(-1.),btScalar(-1.));
	} 
	vecnorm.normalize();
	supVertex+= getMargin() * vecnorm;
	return supVertex;
}